

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_file.c
# Opt level: O0

int log_policy_stream_file_write(log_policy policy,void *buffer,size_t size)

{
  undefined8 *puVar1;
  size_t sVar2;
  long in_RDX;
  void *in_RSI;
  log_policy in_RDI;
  size_t length;
  log_policy_stream_file_data file_data;
  size_t local_38;
  uint local_4;
  
  puVar1 = (undefined8 *)log_policy_instance(in_RDI);
  if (in_RDX == 0) {
    local_38 = 0;
  }
  else {
    local_38 = in_RDX - 1;
  }
  sVar2 = fwrite(in_RSI,1,local_38,(FILE *)*puVar1);
  local_4 = (uint)(sVar2 != local_38);
  return local_4;
}

Assistant:

static int log_policy_stream_file_write(log_policy policy, const void *buffer, const size_t size)
{
	log_policy_stream_file_data file_data = log_policy_instance(policy);

	size_t length = size > 0 ? size - 1 : 0;

	/* Do not write null character */
	if (fwrite(buffer, 1, length, file_data->file) != length)
	{
		return 1;
	}

	return 0;
}